

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdReport.cpp
# Opt level: O2

int CmdReport(CLI *cli,Rules *rules,Database *database,Extensions *extensions)

{
  A2 *pAVar1;
  pointer pbVar2;
  size_type sVar3;
  bool bVar4;
  __type _Var5;
  int args_1;
  A2 *this;
  ostream *poVar6;
  string *psVar7;
  string *this_00;
  long lVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  _Alloc_hider _Var9;
  pointer pbVar10;
  initializer_list<std::shared_ptr<IntervalFilter>_> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  allocator<char> local_44a;
  allocator<char> local_449;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  string report_hint;
  string script_name;
  string local_3c0;
  string script_path;
  string default_hint;
  vector<Interval,_std::allocator<Interval>_> tracked;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Range default_range;
  IntervalFilterAndGroup filtering;
  vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>
  local_280;
  stringstream header;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  Range range;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  script_path._M_dataplus._M_p = (pointer)&script_path.field_2;
  script_path._M_string_length = 0;
  script_path.field_2._M_local_buf[0] = '\0';
  this = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data.
         _M_start;
  pAVar1 = (cli->_args).super__Vector_base<A2,_std::allocator<A2>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  do {
    if (this == pAVar1) {
      if (script_path._M_string_length == 0) {
        this_00 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,"Specify which report to run.",(allocator<char> *)&header);
        __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      getScriptName(&script_name,&script_path);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header,"reports.range",(allocator<char> *)&range);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_range,"all",(allocator<char> *)&tags);
      Rules::get(&default_hint,rules,(string *)&header,(string *)&default_range);
      std::__cxx11::string::~string((string *)&default_range);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_range,"reports.{1}.range",(allocator<char> *)&range);
      std::__cxx11::string::string((string *)&local_d8,(string *)&script_name);
      format<std::__cxx11::string>((string *)&header,(string *)&default_range,&local_d8);
      Rules::get(&report_hint,rules,(string *)&header,&default_hint);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&default_range);
      default_range.end._seconds = 0;
      default_range.end._offset = 0;
      default_range.end._utc = false;
      default_range.end._33_7_ = 0;
      default_range.end._week = 0;
      default_range.end._weekday = 0;
      default_range.end._julian = 0;
      default_range.end._day = 0;
      default_range.start._date = 0;
      default_range.end._year = 0;
      default_range.end._month = 0;
      default_range.start._seconds = 0;
      default_range.start._offset = 0;
      default_range.start._utc = false;
      default_range.start._33_7_ = 0;
      default_range.start._week = 0;
      default_range.start._weekday = 0;
      default_range.start._julian = 0;
      default_range.start._day = 0;
      default_range._vptr_Range = (_func_int **)0x0;
      default_range.start._year = 0;
      default_range.start._month = 0;
      default_range.end._date = 0;
      Range::Range(&default_range);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                     ":",&report_hint);
      expandIntervalHint((string *)&header,&default_range);
      std::__cxx11::string::~string((string *)&header);
      CLI::getTags_abi_cxx11_(&tags,cli);
      CLI::getRange(&range,cli,&default_range);
      std::make_shared<IntervalFilterAllInRange,Range&>((Range *)&input);
      _header = input._M_dataplus._M_p;
      input._M_dataplus._M_p = (pointer)0x0;
      input._M_string_length = 0;
      std::
      make_shared<IntervalFilterAllWithTags,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>&>
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&matches);
      local_258[0]._M_allocated_capacity =
           matches.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_258[0]._8_8_ =
           matches.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      __l._M_len = 2;
      __l._M_array = (iterator)&header;
      std::
      vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
      vector(&local_280,__l,(allocator_type *)&output);
      IntervalFilterAndGroup::IntervalFilterAndGroup(&filtering,&local_280);
      std::
      vector<std::shared_ptr<IntervalFilter>,_std::allocator<std::shared_ptr<IntervalFilter>_>_>::
      ~vector(&local_280);
      lVar8 = 0x18;
      do {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(&header + lVar8));
        lVar8 = lVar8 + -0x10;
      } while (lVar8 != -8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &matches.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&input._M_string_length);
      getTracked(&tracked,database,rules,&filtering.super_IntervalFilter);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header,"temp.report.start",(allocator<char> *)&matches);
      bVar4 = Range::is_started(&range);
      if (bVar4) {
        Datetime::toISO_abi_cxx11_(&input,&range.start);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&input,"",&local_449);
      }
      Rules::set(rules,(string *)&header,&input);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header,"temp.report.end",(allocator<char> *)&matches);
      bVar4 = Range::is_ended(&range);
      if (bVar4) {
        Datetime::toISO_abi_cxx11_(&input,&range.end);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>((string *)&input,"",&local_44a);
      }
      Rules::set(rules,(string *)&header,&input);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header,"temp.report.tags",(allocator<char> *)&output);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&matches,",",(allocator<char> *)&local_3c0);
      joinQuotedIfNeeded<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                (&input,(string *)&matches,&tags);
      Rules::set(rules,(string *)&header,&input);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::string::~string((string *)&matches);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&header,"temp.version",(allocator<char> *)&matches);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&input,"1.8.0-dev",(allocator<char> *)&output);
      Rules::set(rules,(string *)&header,&input);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::string::~string((string *)&header);
      std::__cxx11::stringstream::stringstream((stringstream *)&header);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&input,"",(allocator<char> *)&matches);
      Rules::all(&output,rules,&input);
      std::__cxx11::string::~string((string *)&input);
      for (; output.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             output.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               output.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1) {
        poVar6 = std::operator<<((ostream *)local_258[0]._M_local_buf,
                                 (string *)
                                 output.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        poVar6 = std::operator<<(poVar6,": ");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&matches,"",(allocator<char> *)&local_3c0);
        Rules::get(&input,rules,
                   output.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,(string *)&matches);
        poVar6 = std::operator<<(poVar6,(string *)&input);
        std::operator<<(poVar6,'\n');
        std::__cxx11::string::~string((string *)&input);
        std::__cxx11::string::~string((string *)&matches);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&output);
      std::__cxx11::stringbuf::str();
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&matches,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&output,
                     '\n');
      jsonFromIntervals_abi_cxx11_(&local_3c0,&tracked);
      std::operator+(&input,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &matches,&local_3c0);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&matches);
      std::__cxx11::string::~string((string *)&output);
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      output.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      split(&matches,&input,'\n');
      args_1 = Extensions::callExtension(extensions,&script_path,&matches,&output);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&matches);
      pbVar2 = output.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar10 = output.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (args_1 != 0 &&
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          output.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&matches,"\'{1}\' returned {2} without producing output.",
                   (allocator<char> *)&local_3c0);
        std::__cxx11::string::string((string *)&local_50,(string *)&script_path);
        format<std::__cxx11::string,int>(psVar7,(string *)&matches,&local_50,args_1);
        __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      for (; pbVar10 != pbVar2; pbVar10 = pbVar10 + 1) {
        poVar6 = std::operator<<((ostream *)&std::cout,(string *)pbVar10);
        std::operator<<(poVar6,'\n');
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&output);
      std::__cxx11::string::~string((string *)&input);
      std::__cxx11::stringstream::~stringstream((stringstream *)&header);
      std::vector<Interval,_std::allocator<Interval>_>::~vector(&tracked);
      IntervalFilterAndGroup::~IntervalFilterAndGroup(&filtering);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&tags._M_t);
      std::__cxx11::string::~string((string *)&report_hint);
      std::__cxx11::string::~string((string *)&default_hint);
      std::__cxx11::string::~string((string *)&script_name);
      std::__cxx11::string::~string((string *)&script_path);
      return args_1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&header,"EXT",(allocator<char> *)&default_range);
    bVar4 = A2::hasTag(this,(string *)&header);
    std::__cxx11::string::~string((string *)&header);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&default_hint,"canonical",(allocator<char> *)&tracked);
      A2::attribute(&script_name,this,&default_hint);
      Extensions::all_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&report_hint,extensions);
      sVar3 = report_hint._M_string_length;
      input.field_2._M_allocated_capacity = 0;
      input._M_dataplus._M_p = (pointer)0x0;
      input._M_string_length = 0;
      for (_Var9 = report_hint._M_dataplus; _Var9._M_p != (pointer)sVar3;
          _Var9._M_p = _Var9._M_p + 0x20) {
        Path::Path((Path *)&header,(string *)_Var9._M_p);
        Path::name_abi_cxx11_((string *)&default_range,(Path *)&header);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&input,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &default_range);
        std::__cxx11::string::~string((string *)&default_range);
        Path::~Path((Path *)&header);
      }
      matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      matches.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      autoComplete(&script_name,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&input,&matches,1);
      sVar3 = report_hint._M_string_length;
      if (matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          matches.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&header,"The report \'{1}\' is not recognized.",
                   (allocator<char> *)&range);
        std::__cxx11::string::string((string *)&default_range,(string *)&script_name);
        format<std::__cxx11::string>
                  (psVar7,(string *)&header,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &default_range);
        __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      _Var9 = report_hint._M_dataplus;
      if (0x20 < (ulong)((long)matches.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)matches.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        psVar7 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&header,"The report \'{1}\' is ambiguous, and could mean one of: {2}",
                   (allocator<char> *)&output);
        std::__cxx11::string::string((string *)&default_range,(string *)&script_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tags,", ",(allocator<char> *)&local_3c0);
        join((string *)&range,(string *)&tags,&matches);
        format<std::__cxx11::string,std::__cxx11::string>
                  (psVar7,(string *)&header,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &default_range,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&range);
        __cxa_throw(psVar7,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      for (; _Var9._M_p != (pointer)sVar3; _Var9._M_p = (pointer)((long)_Var9._M_p + 0x20)) {
        Path::Path((Path *)&header,(string *)_Var9._M_p);
        Path::name_abi_cxx11_((string *)&default_range,(Path *)&header);
        _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&default_range,
                                matches.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::~string((string *)&default_range);
        Path::~Path((Path *)&header);
        if (_Var5) {
          std::__cxx11::string::string((string *)&filtering,(string *)_Var9._M_p);
          goto LAB_00135279;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&filtering,"",(allocator<char> *)&header);
LAB_00135279:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&matches);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&input);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&report_hint);
      std::__cxx11::string::operator=((string *)&script_path,(string *)&filtering);
      std::__cxx11::string::~string((string *)&filtering);
      std::__cxx11::string::~string((string *)&script_name);
      std::__cxx11::string::~string((string *)&default_hint);
    }
    this = this + 1;
  } while( true );
}

Assistant:

int CmdReport (
  CLI& cli,
  Rules& rules,
  Database& database,
  const Extensions& extensions)
{
  std::string script_path;
  for (auto& arg : cli._args)
  {
    if (arg.hasTag ("EXT"))
    {
      script_path = findExtension (extensions, arg.attribute ("canonical"));
    }
  }

  if (script_path.empty ())
  {
    throw std::string ("Specify which report to run.");
  }

  auto script_name = getScriptName (script_path);
  auto default_hint = rules.get ("reports.range", "all");
  auto report_hint = rules.get (format ("reports.{1}.range", script_name), default_hint);

  Range default_range = {};
  expandIntervalHint (":" + report_hint, default_range);

  // Create a filter, and if empty, choose the current week.
  auto tags = cli.getTags ();
  auto range = cli.getRange (default_range);

  IntervalFilterAndGroup filtering ({
    std::make_shared <IntervalFilterAllInRange> (range),
    std::make_shared <IntervalFilterAllWithTags> (tags)
  });

  auto tracked = getTracked (database, rules, filtering);

  // Compose Header info.
  rules.set ("temp.report.start", range.is_started () ? range.start.toISO () : "");
  rules.set ("temp.report.end",   range.is_ended ()   ? range.end.toISO ()   : "");
  rules.set ("temp.report.tags", joinQuotedIfNeeded (",", tags));
  rules.set ("temp.version", VERSION);

  std::stringstream header;

  for (auto& name : rules.all ())
  {
    header << name << ": " << rules.get (name) << '\n';
  }

  // Get the data.
  auto input = header.str ()
             + '\n'
             + jsonFromIntervals (tracked);

  // Run the extensions.
  std::vector <std::string> output;
  int rc = extensions.callExtension (script_path, split (input, '\n'), output);
  if (rc != 0 && output.empty ())
  {
    throw format ("'{1}' returned {2} without producing output.", script_path, rc);
  }

  // Display the output.
  for (auto& line : output)
  {
    std::cout << line << '\n';
  }

  return rc;
}